

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

void __thiscall testing::internal::CapturedStream::~CapturedStream(CapturedStream *this)

{
  pointer ptr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  
  ::remove((this->filename_)._M_dataplus._M_p);
  ptr = (this->filename_)._M_dataplus._M_p;
  paVar1 = &(this->filename_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ptr != paVar1) {
    operator_delete(ptr,paVar1->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~CapturedStream() { remove(filename_.c_str()); }